

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexNative_srell.h
# Opt level: O1

void __thiscall
srell::regex_internal::range_pairs::set_eytzinger_layout
          (range_pairs *this,uchar21 mypos,range_pair *srcbase,uchar21 srclen,range_pair *destbase,
          uchar21 destlen)

{
  uchar21 mypos_00;
  uchar21 srclen_00;
  
  while( true ) {
    while( true ) {
      mypos_00 = mypos * 2 + L'\x01';
      if (srclen != L'\0') break;
      destbase[(uint)mypos].first = L'\xffffffff';
      destbase[(uint)mypos].second = L'\0';
      if ((uint)destlen <= (uint)mypos_00) {
        return;
      }
      srclen = L'\0';
      set_eytzinger_layout(this,mypos_00,srcbase,L'\0',destbase,destlen);
      mypos = mypos * 2 + L'\x02';
    }
    srclen_00 = (uint)srclen >> 1;
    destbase[(uint)mypos] = srcbase[(uint)srclen_00];
    if ((uint)destlen <= (uint)mypos_00) break;
    set_eytzinger_layout(this,mypos_00,srcbase,srclen_00,destbase,destlen);
    srcbase = srcbase + (ulong)(uint)srclen_00 + 1;
    srclen = ~srclen_00 + srclen;
    mypos = mypos * 2 + L'\x02';
  }
  return;
}

Assistant:

void set_eytzinger_layout(uchar21 mypos, const range_pair *srcbase, uchar21 srclen,
		range_pair *const destbase, const uchar21 destlen)
	{
		const uchar21 nextpos = (mypos << 1) + 1;

		if (srclen)
		{
			uchar21 mid = srclen >> 1;

			destbase[mypos] = srcbase[mid];

			if (nextpos < destlen)
			{
//				if (mid)
					set_eytzinger_layout(nextpos, srcbase, mid, destbase, destlen);
				++mid;
				srcbase += mid;
				srclen -= mid;
//				if (srclen)
					set_eytzinger_layout(nextpos + 1, srcbase, srclen, destbase, destlen);
			}
		}
		else
		{
			destbase[mypos].set(constants::invalid_u21value, 0);	//  -1, 0);
			if (nextpos < destlen)
			{
				set_eytzinger_layout(nextpos, srcbase, 0, destbase, destlen);
				set_eytzinger_layout(nextpos + 1, srcbase, 0, destbase, destlen);
			}
		}
	}